

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionPrimitves.hpp
# Opt level: O3

TypedTermList __thiscall Kernel::SelectedEquality::biggerSide(SelectedEquality *this)

{
  TermList TVar1;
  TypedTermList TVar2;
  anon_class_16_2_20c48a23 f;
  undefined1 local_2b;
  anon_class_1_0_00000001 local_2a;
  anon_class_1_0_00000001 local_29;
  tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  local_28;
  
  local_28.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Tuple_impl<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&,_false>
  ._M_head_impl =
       (_Head_base<2UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&,_false>
        )&local_2b;
  local_28.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Tuple_impl<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Head_base<1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_false>
  ._M_head_impl = &local_2a;
  local_28.
  super__Tuple_impl<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:276:11)_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:277:11)_&>
  .
  super__Head_base<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_SelectionPrimitves_hpp:275:11)_&,_false>
  ._M_head_impl = &local_29;
  f.this = &this->_inner;
  f.fs_ = &local_28;
  TVar2.super_TermList._content =
       Lib::CoproductImpl::
       RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
       ::
       switchN<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>::match<Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedSummand_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedIntegerEquality_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedUninterpretedEquality_const&)_1_>(Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedSummand_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedIntegerEquality_const&)_1_,Kernel::SelectedEquality::biggerSide()const::_lambda(Kernel::SelectedUninterpretedEquality_const&)_1_)const&::_lambda(auto:1)_1_>
                 ((RawCoproduct<Kernel::SelectedSummand,Kernel::SelectedIntegerEquality,Kernel::SelectedUninterpretedEquality>
                   *)this,f);
  TVar1 = SortHelper::getEqualityArgumentSort
                    (*(Literal **)
                      (*(long *)(this->_inner)._inner.
                                super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                .
                                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                .
                                super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                                ._content + 0x70 +
                      (long)*(int *)((this->_inner)._inner.
                                     super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
                                     .
                                     super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
                                     .
                                     super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
                                     ._content + 8) * 8));
  TVar2._sort._content = TVar1._content;
  return TVar2;
}

Assistant:

TypedTermList biggerSide() const 
    { return TypedTermList(
        _inner.match(
          [](SelectedSummand               const& x) { return x.selectedAtom(); },
          [](SelectedIntegerEquality       const& x) { return x.biggerSide(); },
          [](SelectedUninterpretedEquality const& x) { return x.biggerSide(); }), 
        SortHelper::getEqualityArgumentSort(literal())); }